

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

ScriptFunctionType * __thiscall Js::ScriptFunction::DuplicateType(ScriptFunction *this)

{
  Recycler *alloc;
  ScriptFunctionType *this_00;
  FunctionProxy *this_01;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])&ScriptFunctionType::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_8b8f4dc;
  data.filename._0_4_ = 0xd4;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((((((this->super_ScriptFunctionBase).super_JavascriptFunction.
                          super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).
                       ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)local_40);
  this_00 = (ScriptFunctionType *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  ScriptFunctionType::ScriptFunctionType
            (this_00,(ScriptFunctionType *)
                     (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                     super_RecyclableObject.type.ptr);
  this_01 = GetFunctionProxy(this);
  FunctionProxy::RegisterFunctionObjectType(this_01,this_00);
  return this_00;
}

Assistant:

ScriptFunctionType * ScriptFunction::DuplicateType()
    {
        ScriptFunctionType* type = RecyclerNew(this->GetScriptContext()->GetRecycler(),
            ScriptFunctionType, this->GetScriptFunctionType());

        this->GetFunctionProxy()->RegisterFunctionObjectType(type);

        return type;
    }